

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_ulong.c
# Opt level: O2

uint fmt_ulong(char *s,unsigned_long u)

{
  bool bVar1;
  unsigned_long uVar2;
  uint uVar3;
  unsigned_long q;
  byte *pbVar4;
  
  uVar3 = 1;
  for (uVar2 = u; 9 < uVar2; uVar2 = uVar2 / 10) {
    uVar3 = uVar3 + 1;
  }
  if (s != (char *)0x0) {
    pbVar4 = (byte *)(s + uVar3);
    do {
      pbVar4 = pbVar4 + -1;
      *pbVar4 = (byte)(u % 10) | 0x30;
      bVar1 = 9 < u;
      u = u / 10;
    } while (bVar1);
  }
  return uVar3;
}

Assistant:

unsigned int fmt_ulong(register char *s,register unsigned long u)
{
  register unsigned int len; register unsigned long q;
  len = 1; q = u;
  while (q > 9) { ++len; q /= 10; }
  if (s) {
    s += len;
    do { *--s = '0' + (u % 10); u /= 10; } while(u); /* handles u == 0 */
  }
  return len;
}